

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O3

Vec_Ptr_t * Llb_ManGroupCollect(Llb_Grp_t *pGroup)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vNodes->pArray = ppvVar3;
  Aig_ManIncrementTravId(pGroup->pMan->pAig);
  lVar4 = (long)pGroup->vIns->nSize;
  if (0 < lVar4) {
    ppvVar3 = pGroup->vIns->pArray;
    iVar1 = pGroup->pMan->pAig->nTravIds;
    lVar6 = 0;
    do {
      *(int *)((long)ppvVar3[lVar6] + 0x20) = iVar1;
      lVar6 = lVar6 + 1;
    } while (lVar4 != lVar6);
  }
  pVVar5 = pGroup->vOuts;
  iVar1 = pVVar5->nSize;
  if (0 < (long)iVar1) {
    ppvVar3 = pVVar5->pArray;
    iVar2 = pGroup->pMan->pAig->nTravIds;
    lVar4 = 0;
    do {
      *(int *)((long)ppvVar3[lVar4] + 0x20) = iVar2 + -1;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        Llb_ManGroupCollect_rec(pGroup->pMan->pAig,(Aig_Obj_t *)pVVar5->pArray[lVar4],vNodes);
        lVar4 = lVar4 + 1;
        pVVar5 = pGroup->vOuts;
      } while (lVar4 < pVVar5->nSize);
    }
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Llb_ManGroupCollect( Llb_Grp_t * pGroup )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    vNodes = Vec_PtrAlloc( 100 );
    Aig_ManIncrementTravId( pGroup->pMan->pAig );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
        Aig_ObjSetTravIdCurrent( pGroup->pMan->pAig, pObj );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
        Aig_ObjSetTravIdPrevious( pGroup->pMan->pAig, pObj );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
        Llb_ManGroupCollect_rec( pGroup->pMan->pAig, pObj, vNodes );
    return vNodes;
}